

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::ConvertToGalactic
          (CECoordinates *this,double jd,double longitude,double latitude,double elevation_m,
          double pressure_hPa,double temperature_celsius,double relative_humidity,double dut1,
          double xp,double yp,double wavelength_um)

{
  double *in_RSI;
  CECoordinates *in_RDI;
  double *in_stack_00000008;
  CEDate *in_stack_00000010;
  double *in_stack_00000018;
  double ycoord_new;
  double xcoord_new;
  double *in_stack_fffffffffffffeb8;
  double *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  CEDate *in_stack_fffffffffffffed0;
  double *in_stack_fffffffffffffed8;
  CEDate *in_stack_fffffffffffffee0;
  CEAngle *in_stack_fffffffffffffee8;
  CECoordinates *in_stack_fffffffffffffef0;
  double in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff00;
  CECoordinates *julian_date;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  double in_stack_ffffffffffffff28;
  double in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  double in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  double in_stack_ffffffffffffff60;
  
  if (*(int *)(in_RSI + 5) == 0) {
    CppEphem::julian_date_J2000();
    in_stack_fffffffffffffef0 = (CECoordinates *)(**(code **)((long)*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x38))();
    CEDate::CEDate(in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8,
                   (CEDateType)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    CIRS2Galactic((double)in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8,
                  (double *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                  in_stack_fffffffffffffed0,(CEAngleType *)in_stack_fffffffffffffec8);
    CEDate::~CEDate((CEDate *)0x14e8d0);
    julian_date = in_RDI;
  }
  else if (*(int *)(in_RSI + 5) == 1) {
    CppEphem::julian_date_J2000();
    in_stack_fffffffffffffee8 = (CEAngle *)(**(code **)((long)*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x38))();
    ICRS2Galactic((double)in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffec8,
                  in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(CEAngleType *)0x14e95d);
    julian_date = in_RDI;
  }
  else if (*(int *)(in_RSI + 5) == 2) {
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)((long)*in_RSI + 0x38))();
    julian_date = in_RDI;
  }
  else {
    julian_date = in_RDI;
    if (*(int *)(in_RSI + 5) == 3) {
      CppEphem::julian_date_J2000();
      in_stack_fffffffffffffee0 = (CEDate *)(**(code **)((long)*in_RSI + 0x28))();
      CppEphem::julian_date_J2000();
      (**(code **)((long)*in_RSI + 0x38))();
      Observed2Galactic(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        (double *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_RSI,(double)julian_date,(double)in_RDI,in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0,
                        (double)in_stack_fffffffffffffee8,in_stack_ffffffffffffff40,
                        (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        in_stack_ffffffffffffff50,
                        (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        in_stack_ffffffffffffff60);
      in_stack_fffffffffffffec8 = in_stack_00000008;
      in_stack_fffffffffffffed0 = in_stack_00000010;
      in_stack_fffffffffffffed8 = in_stack_00000018;
    }
  }
  CEAngle::CEAngle((CEAngle *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  CEAngle::CEAngle((CEAngle *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  CECoordinates(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (CEAngle *)in_stack_fffffffffffffee0,(CECoordinateType *)in_stack_fffffffffffffed8);
  CEAngle::~CEAngle((CEAngle *)0x14eae0);
  CEAngle::~CEAngle((CEAngle *)0x14eaed);
  return julian_date;
}

Assistant:

CECoordinates CECoordinates::ConvertToGalactic(double jd,
                                double longitude,
                                double latitude,
                                double elevation_m,
                                double pressure_hPa,
                                double temperature_celsius,
                                double relative_humidity,
                                double dut1,
                                double xp, double yp,
                                double wavelength_um)
{
    double xcoord_new(0.0);
    double ycoord_new(0.0);
    if (coord_type_ == CECoordinateType::CIRS) {
        CIRS2Galactic(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new, jd, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        ICRS2Galactic(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        xcoord_new = XCoordinate_Rad() ;
        ycoord_new = YCoordinate_Rad() ;
    } else if (coord_type_ == CECoordinateType::OBSERVED) {
        Observed2Galactic(XCoordinate_Rad(), YCoordinate_Rad(),
                          &xcoord_new, &ycoord_new,
                          jd, longitude, latitude,
                          elevation_m, pressure_hPa,
                          temperature_celsius, relative_humidity,
                          dut1, xp, yp, wavelength_um) ;
    }
    
    return CECoordinates(xcoord_new, ycoord_new, CECoordinateType::GALACTIC) ;
}